

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sign.c
# Opt level: O0

HCOSE_SIGNER COSE_Sign_add_signer(HCOSE_SIGN hSign,cn_cbor *pkey,int algId,cose_errback *perr)

{
  _Bool _Var1;
  cose_error cVar2;
  cn_cbor *pcVar3;
  cn_cbor_errback local_50;
  cn_cbor_errback cbor_error;
  HCOSE_SIGNER hSigner;
  cn_cbor *cbor2;
  cn_cbor *cbor;
  cose_errback *perr_local;
  int algId_local;
  cn_cbor *pkey_local;
  HCOSE_SIGN hSign_local;
  
  hSigner = (HCOSE_SIGNER)0x0;
  cbor_error.pos = 0;
  cbor_error.err = CN_CBOR_NO_ERROR;
  _Var1 = IsValidSignHandle(hSign);
  if (_Var1) {
    if (pkey == (cn_cbor *)0x0) {
      if (perr != (cose_errback *)0x0) {
        perr->err = COSE_ERR_INVALID_PARAMETER;
      }
    }
    else {
      cbor_error = (cn_cbor_errback)COSE_Signer_Init(perr);
      if (cbor_error != (cn_cbor_errback)0x0) {
        hSigner = (HCOSE_SIGNER)cn_cbor_int_create((long)algId,&local_50);
        if ((cn_cbor *)hSigner == (cn_cbor *)0x0) {
          if (perr != (cose_errback *)0x0) {
            cVar2 = _MapFromCBOR(local_50);
            perr->err = cVar2;
          }
        }
        else {
          _Var1 = COSE_Signer_map_put_int((HCOSE_SIGNER)cbor_error,1,(cn_cbor *)hSigner,1,perr);
          if (_Var1) {
            hSigner = (HCOSE_SIGNER)0x0;
            pcVar3 = cn_cbor_mapget_int(pkey,2);
            if (pcVar3 != (cn_cbor *)0x0) {
              if (pcVar3->type != CN_CBOR_BYTES) {
                if (perr != (cose_errback *)0x0) {
                  perr->err = COSE_ERR_INVALID_PARAMETER;
                }
                goto LAB_00350588;
              }
              hSigner = (HCOSE_SIGNER)
                        cn_cbor_data_create((pcVar3->v).bytes,pcVar3->length,&local_50);
              if ((cn_cbor *)hSigner == (cn_cbor *)0x0) {
                if (perr != (cose_errback *)0x0) {
                  cVar2 = _MapFromCBOR(local_50);
                  perr->err = cVar2;
                }
                goto LAB_00350588;
              }
              _Var1 = COSE_Signer_map_put_int((HCOSE_SIGNER)cbor_error,4,(cn_cbor *)hSigner,2,perr);
              if (!_Var1) goto LAB_00350588;
            }
            hSigner = (HCOSE_SIGNER)0x0;
            _Var1 = COSE_Signer_SetKey((HCOSE_SIGNER)cbor_error,pkey,perr);
            if ((_Var1) && (_Var1 = COSE_Sign_AddSigner(hSign,(HCOSE_SIGNER)cbor_error,perr), _Var1)
               ) {
              return (HCOSE_SIGNER)cbor_error;
            }
          }
        }
      }
    }
  }
  else if (perr != (cose_errback *)0x0) {
    perr->err = COSE_ERR_INVALID_HANDLE;
  }
LAB_00350588:
  if (hSigner != (HCOSE_SIGNER)0x0) {
    cn_cbor_free((cn_cbor *)hSigner);
  }
  if (cbor_error != (cn_cbor_errback)0x0) {
    COSE_Signer_Free((HCOSE_SIGNER)cbor_error);
  }
  return (HCOSE_SIGNER)0x0;
}

Assistant:

HCOSE_SIGNER COSE_Sign_add_signer(HCOSE_SIGN hSign, const cn_cbor * pkey, int algId, cose_errback * perr)
{
#ifdef USE_CBOR_CONTEXT
	cn_cbor_context * context = NULL;
	COSE_SignMessage * pMessage = (COSE_SignMessage *)hSign;
#endif
	const cn_cbor * cbor;
	cn_cbor * cbor2 = NULL;
	HCOSE_SIGNER hSigner = NULL;
	cn_cbor_errback cbor_error;

	CHECK_CONDITION(IsValidSignHandle(hSign), COSE_ERR_INVALID_HANDLE);
	CHECK_CONDITION(pkey != NULL, COSE_ERR_INVALID_PARAMETER);

#ifdef USE_CBOR_CONTEXT
	context = &pMessage->m_message.m_allocContext;
#endif

	hSigner = COSE_Signer_Init(CBOR_CONTEXT_PARAM_COMMA perr);
	if (hSigner == NULL) goto errorReturn;


	cbor2 = cn_cbor_int_create(algId, CBOR_CONTEXT_PARAM_COMMA &cbor_error);
	CHECK_CONDITION_CBOR(cbor2 != NULL, cbor_error);
	if (!COSE_Signer_map_put_int(hSigner, COSE_Header_Algorithm, cbor2, COSE_PROTECT_ONLY, perr)) goto errorReturn;
	cbor2 = NULL;

	cbor = cn_cbor_mapget_int(pkey, COSE_Key_ID);
	if (cbor != NULL) {
		CHECK_CONDITION(cbor->type == CN_CBOR_BYTES, COSE_ERR_INVALID_PARAMETER);
		cbor2 = cn_cbor_data_create(cbor->v.bytes, (int) cbor->length, CBOR_CONTEXT_PARAM_COMMA &cbor_error);
		CHECK_CONDITION_CBOR(cbor2 != NULL, cbor_error);
		if (!COSE_Signer_map_put_int(hSigner, COSE_Header_KID, cbor2, COSE_UNPROTECT_ONLY, perr)) goto errorReturn;
		cbor2 = NULL;
	}

	if (!COSE_Signer_SetKey(hSigner, pkey, perr)) goto errorReturn;

	if (!COSE_Sign_AddSigner(hSign, hSigner, perr)) goto errorReturn;

	return hSigner;

errorReturn:
	if (cbor2 != NULL) CN_CBOR_FREE((void *)cbor2, context);
	if (hSigner != NULL) COSE_Signer_Free(hSigner);
	return NULL;
}